

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void add_variable(ch_compilation *comp,ch_lexeme name)

{
  _Bool _Var1;
  ch_compilation *comp_local;
  ch_lexeme name_local;
  
  if (comp->scope->locals_size == 0xff) {
    error(comp,"Exceeded variable limit in scope.");
  }
  else {
    _Var1 = scope_lookup(comp->scope,name,(uint8_t *)0x0);
    if (_Var1) {
      error(comp,"Variable has already been defined: %.*s",name.size,name.start);
    }
    else if (((comp->emit).emit_scope)->parent == (ch_emit_scope *)0x0) {
      add_global(comp,name);
    }
    else {
      add_local(comp,name);
    }
  }
  return;
}

Assistant:

void add_variable(ch_compilation *comp, ch_lexeme name) {
  if (comp->scope->locals_size == UINT8_MAX) {
    error(comp, "Exceeded variable limit in scope.");
    return;
  }

  if (scope_lookup(comp->scope, name, NULL)) {
    error(comp, "Variable has already been defined: %.*s", name.size,
          name.start);
    return;
  }

  if (CH_EMITTING_GLOBALLY(GET_EMIT(comp))) {
    add_global(comp, name);
  } else {
    add_local(comp, name);
  }
}